

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O3

void update_multiple_arg(void *field,char ***orig_field,uint field_given,uint prev_given,
                        generic_value *default_value,cmdline_parser_arg_type arg_type,
                        generic_list *list)

{
  generic_value *pgVar1;
  char **ppcVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __size;
  ulong uVar5;
  bool bVar6;
  
  if (default_value != (generic_value *)0x0 && prev_given != 0) {
    __size = (ulong)(field_given + prev_given) << 3;
    ppcVar2 = (char **)realloc(*orig_field,__size);
    *orig_field = ppcVar2;
    pvVar3 = realloc(*field,__size);
    *(void **)field = pvVar3;
    if (-1 < (int)(prev_given - 1)) {
      uVar5 = (ulong)(prev_given - 1);
      do {
        uVar4 = (ulong)(field_given + (int)uVar5);
        *(generic_value *)(*field + uVar4 * 8) = *default_value;
        *(generic_value *)(*orig_field + uVar4) = default_value[1];
        pgVar1 = (generic_value *)default_value[2].string_arg;
        free(default_value);
        bVar6 = uVar5 != 0;
        uVar5 = uVar5 - 1;
        default_value = pgVar1;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

static
void update_multiple_arg(void *field, char ***orig_field,
               unsigned int field_given, unsigned int prev_given, union generic_value *default_value,
               cmdline_parser_arg_type arg_type,
               struct generic_list *list)
{
  int i;
  struct generic_list *tmp;

  if (prev_given && list) {
    *orig_field = (char **) realloc (*orig_field, (field_given + prev_given) * sizeof (char *));

    switch(arg_type) {
    case ARG_DOUBLE:
      *((double **)field) = (double *)realloc (*((double **)field), (field_given + prev_given) * sizeof (double)); break;
    case ARG_STRING:
      *((char ***)field) = (char **)realloc (*((char ***)field), (field_given + prev_given) * sizeof (char *)); break;
    default:
      break;
    };
    
    for (i = (prev_given - 1); i >= 0; --i)
      {
        tmp = list;
        
        switch(arg_type) {
        case ARG_DOUBLE:
          (*((double **)field))[i + field_given] = tmp->arg.double_arg; break;
        case ARG_STRING:
          (*((char ***)field))[i + field_given] = tmp->arg.string_arg; break;
        default:
          break;
        }        
        (*orig_field) [i + field_given] = list->orig;
        list = list->next;
        free (tmp);
      }
  } else { /* set the default value */
    if (default_value && ! field_given) {
      switch(arg_type) {
      case ARG_DOUBLE:
        if (! *((double **)field)) {
          *((double **)field) = (double *)malloc (sizeof (double));
          (*((double **)field))[0] = default_value->double_arg;
        }
        break;
      case ARG_STRING:
        if (! *((char ***)field)) {
          *((char ***)field) = (char **)malloc (sizeof (char *));
          (*((char ***)field))[0] = gengetopt_strdup(default_value->string_arg);
        }
        break;
      default: break;
      }
      if (!(*orig_field)) {
        *orig_field = (char **) malloc (sizeof (char *));
        (*orig_field)[0] = 0;
      }
    }
  }
}